

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionAnalyzer.cpp
# Opt level: O3

bool __thiscall
wasm::ExpressionAnalyzer::flexibleEqual(wasm::Expression*,wasm::Expression*,std::function<bool(wasm
::Expression*,wasm::Expression*)>)::Comparer::compareNodes(wasm::Expression*,wasm::Expression__
          (void *this,Expression *left,Expression *right)

{
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar1;
  undefined8 *puVar2;
  uintptr_t uVar3;
  iterator iVar4;
  bool bVar5;
  iterator iVar6;
  long lVar7;
  mapped_type *pmVar8;
  char *pcVar9;
  ResumeThrow *castRight;
  Expression *pEVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar14;
  ResumeThrow *castLeft;
  _Base_ptr p_Stack_48;
  Expression *child;
  _Base_ptr local_38;
  
  if (left->_id != right->_id) {
    return false;
  }
  switch(left->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    uVar3 = left[2].type.id;
    if (uVar3 != right[2].type.id) {
      return false;
    }
    if (uVar3 != 0) {
      local_38 = (_Base_ptr)((long)this + 0x30);
      uVar13 = 0;
      do {
        if (left[2].type.id <= uVar13) goto LAB_006a3ad3;
        p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 2) + uVar13 * 8);
        iVar4._M_current = *(Expression ***)((long)this + 0x38);
        if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4,
                     (Expression **)&stack0xffffffffffffffb8);
        }
        else {
          *iVar4._M_current = (Expression *)p_Stack_48;
          *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
        }
        uVar13 = uVar13 + 1;
      } while (uVar3 != uVar13);
      uVar3 = right[2].type.id;
      if (uVar3 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x48);
        uVar13 = 0;
        do {
          if (right[2].type.id <= uVar13) goto LAB_006a3ad3;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 2) + uVar13 * 8);
          iVar4._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar4._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar13 = uVar13 + 1;
        } while (uVar3 != uVar13);
      }
    }
    goto LAB_006a2cbd;
  case IfId:
  case SelectId:
  case ArraySetId:
  case StringSliceWTFId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    goto LAB_006a383d;
  case LoopId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
LAB_006a2cbd:
    if ((right[1].type.id != 0) != (left[1].type.id != 0)) {
      return false;
    }
    pmVar8 = std::
             map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
             ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                           *)this,(key_type *)(left + 1));
    pcVar9 = (char *)right[1].type.id;
    (pmVar8->super_IString).str._M_len = *(size_t *)(right + 1);
    (pmVar8->super_IString).str._M_str = pcVar9;
    return true;
  case BreakId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
  case RethrowId:
    p_Stack_48 = *(_Base_ptr *)(left + 1);
    child = (Expression *)left[1].type.id;
    pEVar10 = (Expression *)right[1].type.id;
    iVar6 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
            ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)this,(key_type *)&stack0xffffffffffffffb8);
    if (iVar6._M_node != (_Base_ptr)((long)this + 8)) {
      child = (Expression *)iVar6._M_node[1]._M_right;
    }
    if (child != pEVar10) {
      return false;
    }
    return true;
  case SwitchId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[4].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[4].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 4));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 4));
    p_Stack_48 = *(_Base_ptr *)(left + 3);
    child = (Expression *)left[3].type.id;
    pEVar10 = (Expression *)right[3].type.id;
    iVar6 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
            ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)this,(key_type *)&stack0xffffffffffffffb8);
    local_38 = (_Base_ptr)((long)this + 8);
    if (iVar6._M_node != local_38) {
      p_Stack_48 = iVar6._M_node[1]._M_left;
      child = (Expression *)iVar6._M_node[1]._M_right;
    }
    if (child != pEVar10) {
      return false;
    }
    uVar3 = left[1].type.id;
    if (uVar3 != right[1].type.id) {
      return false;
    }
    if (uVar3 == 0) {
      return true;
    }
    uVar13 = 0;
    uVar12 = 1;
    while (uVar13 < right[1].type.id) {
      puVar2 = (undefined8 *)(*(long *)(left + 1) + uVar13 * 0x10);
      p_Stack_48 = (_Base_ptr)*puVar2;
      child = (Expression *)puVar2[1];
      pEVar10 = *(Expression **)(*(long *)(right + 1) + 8 + uVar13 * 0x10);
      iVar6 = std::
              _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                      *)this,(key_type *)&stack0xffffffffffffffb8);
      if (iVar6._M_node != local_38) {
        p_Stack_48 = iVar6._M_node[1]._M_left;
        child = (Expression *)iVar6._M_node[1]._M_right;
      }
      if (child != pEVar10) {
        return false;
      }
      bVar5 = left[1].type.id <= uVar12;
      uVar13 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
      if (bVar5) {
        return true;
      }
    }
LAB_006a3af2:
    pcVar9 = 
    "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
    ;
    goto LAB_006a3ae8;
  case CallId:
    uVar3 = left[1].type.id;
    if (uVar3 == right[1].type.id) {
      if (uVar3 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x30);
        uVar13 = 0;
        do {
          if (left[1].type.id <= uVar13) goto LAB_006a3ad3;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 1) + uVar13 * 8);
          iVar4._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar4._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar13 = uVar13 + 1;
        } while (uVar3 != uVar13);
        uVar3 = right[1].type.id;
        if (uVar3 != 0) {
          local_38 = (_Base_ptr)((long)this + 0x48);
          uVar13 = 0;
          do {
            if (right[1].type.id <= uVar13) goto LAB_006a3ad3;
            p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 1) + uVar13 * 8);
            iVar4._M_current = *(Expression ***)((long)this + 0x50);
            if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              _M_realloc_insert<wasm::Expression*const&>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,
                         iVar4,(Expression **)&stack0xffffffffffffffb8);
            }
            else {
              *iVar4._M_current = (Expression *)p_Stack_48;
              *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
            }
            uVar13 = uVar13 + 1;
          } while (uVar3 != uVar13);
        }
      }
      if ((left[3].type.id == right[3].type.id) && (left[4]._id == right[4]._id)) {
        return true;
      }
    }
    break;
  case CallIndirectId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[3].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[3].type);
    if ((left[4].type.id == right[4].type.id) &&
       (uVar13 = *(ulong *)(left + 2), uVar13 == *(ulong *)(right + 2))) {
      if (uVar13 != 0) {
        uVar12 = 0;
        local_38 = (_Base_ptr)((long)this + 0x30);
        do {
          if (*(ulong *)(left + 2) <= uVar12) goto LAB_006a3ad3;
          p_Stack_48 = *(_Base_ptr *)(left[1].type.id + uVar12 * 8);
          iVar4._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar4._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
        uVar13 = *(ulong *)(right + 2);
        if (uVar13 != 0) {
          uVar12 = 0;
          do {
            if (*(ulong *)(right + 2) <= uVar12) goto LAB_006a3ad3;
            p_Stack_48 = *(_Base_ptr *)(right[1].type.id + uVar12 * 8);
            iVar4._M_current = *(Expression ***)((long)this + 0x50);
            if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              _M_realloc_insert<wasm::Expression*const&>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                         ((long)this + 0x48),iVar4,(Expression **)&stack0xffffffffffffffb8);
            }
            else {
              *iVar4._M_current = (Expression *)p_Stack_48;
              *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
            }
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
        }
      }
      if ((*(long *)(left + 1) == *(long *)(right + 1)) && (left[5]._id == right[5]._id)) {
        return true;
      }
    }
    break;
  case LocalGetId:
    goto switchD_006a1f00_caseD_8;
  case LocalSetId:
  case UnaryId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    goto LAB_006a2d79;
  case GlobalGetId:
  case MemorySizeId:
  case DataDropId:
  case RefFuncId:
  case TableSizeId:
  case StringConstId:
    goto switchD_006a1f00_caseD_a;
  case GlobalSetId:
  case TableGetId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    goto LAB_006a2bf5;
  case LoadId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 3));
    if (left[1]._id != right[1]._id) {
      return false;
    }
    if (left[1].field_0x1 != right[1].field_0x1) {
      return false;
    }
    if (left[1].type.id != right[1].type.id) {
      return false;
    }
    if (*(long *)(left + 2) != *(long *)(right + 2)) {
      return false;
    }
    if ((char)left[2].type.id != (char)right[2].type.id) {
      return false;
    }
    goto LAB_006a2575;
  case StoreId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[3].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[3].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 3));
    if (((left[1]._id == right[1]._id) && (left[1].type.id == right[1].type.id)) &&
       ((*(long *)(left + 2) == *(long *)(right + 2) &&
        ((((char)left[2].type.id == (char)right[2].type.id &&
          (*(long *)(left + 4) == *(long *)(right + 4))) &&
         (*(long *)(left + 5) == *(long *)(right + 5))))))) {
      return true;
    }
    break;
  case ConstId:
    bVar5 = Literal::operator!=((Literal *)(left + 1),(Literal *)(right + 1));
    if (!bVar5) {
      return true;
    }
    break;
  case BinaryId:
  case SIMDShiftId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    goto LAB_006a2d61;
  case DropId:
  case ReturnId:
  case RefIsNullId:
  case ThrowRefId:
  case RefI31Id:
  case RefCastId:
  case ArrayLenId:
  case ContNewId:
    goto switchD_006a1f00_caseD_12;
  case MemoryGrowId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 1));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 1));
    if (*(long *)(left + 2) == *(long *)(right + 2)) {
      return true;
    }
    break;
  default:
    goto LAB_006a3ac4;
  case AtomicRMWId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    if (left[1].field_0x4 != right[1].field_0x4) {
      return false;
    }
    if (left[1].type.id != right[1].type.id) {
      return false;
    }
    goto LAB_006a2e9b;
  case AtomicCmpxchgId:
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 3));
    pvVar14 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x48)
    ;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)(right + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&left[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)(right + 2));
    if (left[1]._id != right[1]._id) {
      return false;
    }
    goto LAB_006a201b;
  case AtomicWaitId:
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&left[2].type);
    pvVar14 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x48)
    ;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)(right + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&left[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)&right[1].type);
    if (*(long *)(left + 1) != *(long *)(right + 1)) {
      return false;
    }
    if (*(long *)(left + 3) != *(long *)(right + 3)) {
      return false;
    }
    goto LAB_006a2575;
  case AtomicNotifyId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[1].type);
    if (*(long *)(left + 1) != *(long *)(right + 1)) {
      return false;
    }
    goto LAB_006a3024;
  case AtomicFenceId:
    if (left[1]._id == right[1]._id) {
      return true;
    }
    break;
  case SIMDExtractId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    goto LAB_006a2e2a;
  case SIMDReplaceId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
LAB_006a2e2a:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[1].type);
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
LAB_006a2e43:
    if (left[2]._id != right[2]._id) {
      return false;
    }
    return true;
  case SIMDShuffleId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 1));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 1));
    lVar7 = 0;
    do {
      if ((&left[2]._id)[lVar7] != (&right[2]._id)[lVar7]) {
        return false;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    return true;
  case SIMDTernaryId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
LAB_006a2d61:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
LAB_006a2d79:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[1].type);
switchD_006a1f00_caseD_8:
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    return true;
  case SIMDLoadId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    if (left[1].type.id != right[1].type.id) {
      return false;
    }
    if (*(long *)(left + 2) != *(long *)(right + 2)) {
      return false;
    }
LAB_006a2e9b:
    if (left[3].type.id != right[3].type.id) {
      return false;
    }
    return true;
  case SIMDLoadStoreLaneId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[3].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[3].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 3));
    if ((((*(int *)(left + 1) == *(int *)(right + 1)) && (left[1].type.id == right[1].type.id)) &&
        (*(long *)(left + 2) == *(long *)(right + 2))) &&
       (((char)left[2].type.id == (char)right[2].type.id && (left[4].type.id == right[4].type.id))))
    {
      return true;
    }
    break;
  case MemoryInitId:
  case TableInitId:
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 3));
    pvVar14 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x48)
    ;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)(right + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&left[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)(right + 2));
LAB_006a201b:
    if (left[1].type.id != right[1].type.id) {
      return false;
    }
LAB_006a2575:
    if (*(long *)(left + 4) != *(long *)(right + 4)) {
      return false;
    }
    return true;
  case MemoryCopyId:
  case TableCopyId:
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 2));
    pvVar14 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x48)
    ;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)(right + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&left[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)&right[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 1));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)(right + 1));
    if (*(long *)(left + 4) != *(long *)(right + 4)) {
      return false;
    }
    goto LAB_006a3024;
  case MemoryFillId:
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 2));
    pvVar14 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x48)
    ;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)(right + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&left[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)&right[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 1));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar14,(value_type *)(right + 1));
LAB_006a3024:
    if (*(long *)(left + 3) != *(long *)(right + 3)) {
      return false;
    }
    return true;
  case RefEqId:
  case ArrayNewId:
  case StringConcatId:
  case StringWTF16GetId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    goto LAB_006a3855;
  case TableSetId:
  case TableGrowId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    goto LAB_006a2bdd;
  case TableFillId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
LAB_006a2bdd:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
LAB_006a2bf5:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
    goto switchD_006a1f00_caseD_a;
  case TryId:
    p_Stack_48 = (_Base_ptr)left[6].type.id;
    child = *(Expression **)(left + 7);
    pEVar10 = *(Expression **)(right + 7);
    iVar6 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
            ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)this,(key_type *)&stack0xffffffffffffffb8);
    if (iVar6._M_node != (_Base_ptr)((long)this + 8)) {
      p_Stack_48 = iVar6._M_node[1]._M_left;
      child = (Expression *)iVar6._M_node[1]._M_right;
    }
    if (child != pEVar10) {
      return false;
    }
    uVar13 = *(ulong *)(left + 5);
    if (uVar13 != *(ulong *)(right + 5)) {
      return false;
    }
    if (uVar13 != 0) {
      local_38 = (_Base_ptr)((long)this + 0x30);
      uVar12 = 0;
      do {
        if (*(ulong *)(left + 5) <= uVar12) goto LAB_006a3ad3;
        p_Stack_48 = *(_Base_ptr *)(left[4].type.id + uVar12 * 8);
        iVar4._M_current = *(Expression ***)((long)this + 0x38);
        if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4,
                     (Expression **)&stack0xffffffffffffffb8);
        }
        else {
          *iVar4._M_current = (Expression *)p_Stack_48;
          *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
        }
        uVar12 = uVar12 + 1;
      } while (uVar13 != uVar12);
      uVar13 = *(ulong *)(right + 5);
      if (uVar13 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x48);
        uVar12 = 0;
        do {
          if (*(ulong *)(right + 5) <= uVar12) goto LAB_006a3ad3;
          p_Stack_48 = *(_Base_ptr *)(right[4].type.id + uVar12 * 8);
          iVar4._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar4._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
      }
    }
    uVar13 = *(ulong *)(left + 3);
    if (uVar13 != *(ulong *)(right + 3)) {
      return false;
    }
    if (uVar13 != 0) {
      uVar11 = 1;
      uVar12 = 0;
      do {
        if (*(long *)(left[2].type.id + 8 + uVar12 * 0x10) !=
            *(long *)(right[2].type.id + 8 + uVar12 * 0x10)) {
          return false;
        }
        uVar12 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar12 < uVar13);
    }
    if ((right[1].type.id != 0) != (left[1].type.id != 0)) {
      return false;
    }
    pmVar8 = std::
             map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
             ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                           *)this,(key_type *)(left + 1));
    pcVar9 = (char *)right[1].type.id;
    (pmVar8->super_IString).str._M_len = *(size_t *)(right + 1);
    (pmVar8->super_IString).str._M_str = pcVar9;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    goto LAB_006a20f0;
  case TryTableId:
    uVar13 = *(ulong *)(left + 8);
    if (uVar13 != *(ulong *)(right + 8)) {
      return false;
    }
    if (uVar13 != 0) {
      uVar11 = 1;
      uVar12 = 0;
      do {
        if (*(long *)(left[7].type.id + uVar12 * 8) != *(long *)(right[7].type.id + uVar12 * 8)) {
          return false;
        }
        uVar12 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar12 < uVar13);
    }
    uVar13 = *(ulong *)(left + 6);
    if (uVar13 != *(ulong *)(right + 6)) {
      return false;
    }
    if (uVar13 != 0) {
      uVar11 = 1;
      uVar12 = 0;
      do {
        if (*(char *)(left[5].type.id + uVar12) != *(char *)(right[5].type.id + uVar12)) {
          return false;
        }
        uVar12 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar12 < uVar13);
    }
    if (*(long *)(left + 4) != *(long *)(right + 4)) {
      return false;
    }
    if (*(long *)(left + 4) != 0) {
      local_38 = (_Base_ptr)((long)this + 8);
      uVar13 = 0;
      uVar12 = 1;
      do {
        if (*(ulong *)(right + 4) <= uVar13) goto LAB_006a3af2;
        puVar2 = (undefined8 *)(left[3].type.id + uVar13 * 0x10);
        p_Stack_48 = (_Base_ptr)*puVar2;
        child = (Expression *)puVar2[1];
        pEVar10 = *(Expression **)(right[3].type.id + 8 + uVar13 * 0x10);
        iVar6 = std::
                _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                        *)this,(key_type *)&stack0xffffffffffffffb8);
        if (iVar6._M_node != local_38) {
          p_Stack_48 = iVar6._M_node[1]._M_left;
          child = (Expression *)iVar6._M_node[1]._M_right;
        }
        if (child != pEVar10) {
          return false;
        }
        bVar5 = uVar12 < *(ulong *)(left + 4);
        uVar13 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar5);
    }
    uVar13 = *(ulong *)(left + 2);
    if (uVar13 != *(ulong *)(right + 2)) {
      return false;
    }
    if (uVar13 != 0) {
      uVar11 = 1;
      uVar12 = 0;
      do {
        if (*(long *)(left[1].type.id + 8 + uVar12 * 0x10) !=
            *(long *)(right[1].type.id + 8 + uVar12 * 0x10)) {
          return false;
        }
        uVar12 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar12 < uVar13);
    }
    goto switchD_006a1f00_caseD_12;
  case ThrowId:
    uVar3 = left[2].type.id;
    if (uVar3 != right[2].type.id) {
      return false;
    }
    if (uVar3 != 0) {
      local_38 = (_Base_ptr)((long)this + 0x30);
      uVar13 = 0;
      do {
        if (left[2].type.id <= uVar13) goto LAB_006a3ad3;
        p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 2) + uVar13 * 8);
        iVar4._M_current = *(Expression ***)((long)this + 0x38);
        if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4,
                     (Expression **)&stack0xffffffffffffffb8);
        }
        else {
          *iVar4._M_current = (Expression *)p_Stack_48;
          *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
        }
        uVar13 = uVar13 + 1;
      } while (uVar3 != uVar13);
      uVar3 = right[2].type.id;
      if (uVar3 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x48);
        uVar13 = 0;
        do {
          if (right[2].type.id <= uVar13) goto LAB_006a3ad3;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 2) + uVar13 * 8);
          iVar4._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar4._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar13 = uVar13 + 1;
        } while (uVar3 != uVar13);
      }
    }
    goto switchD_006a1f00_caseD_a;
  case TupleMakeId:
    uVar3 = left[1].type.id;
    if (uVar3 != right[1].type.id) {
      return false;
    }
    if (uVar3 == 0) {
      return true;
    }
    local_38 = (_Base_ptr)((long)this + 0x30);
    uVar13 = 0;
    do {
      if (left[1].type.id <= uVar13) goto LAB_006a3ad3;
      p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 1) + uVar13 * 8);
      iVar4._M_current = *(Expression ***)((long)this + 0x38);
      if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4,
                   (Expression **)&stack0xffffffffffffffb8);
      }
      else {
        *iVar4._M_current = (Expression *)p_Stack_48;
        *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
      }
      uVar13 = uVar13 + 1;
    } while (uVar3 != uVar13);
    uVar3 = right[1].type.id;
    if (uVar3 == 0) {
      return true;
    }
    uVar13 = 0;
    while (uVar13 < right[1].type.id) {
      p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 1) + uVar13 * 8);
      iVar4._M_current = *(Expression ***)((long)this + 0x50);
      if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                   ((long)this + 0x48),iVar4,(Expression **)&stack0xffffffffffffffb8);
      }
      else {
        *iVar4._M_current = (Expression *)p_Stack_48;
        *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
      }
      uVar13 = uVar13 + 1;
      if (uVar3 == uVar13) {
        return true;
      }
    }
    goto LAB_006a3ad3;
  case TupleExtractId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 1));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 1));
    if ((int)left[1].type.id == (int)right[1].type.id) {
      return true;
    }
    break;
  case I31GetId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 1));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 1));
    if ((char)left[1].type.id == (char)right[1].type.id) {
      return true;
    }
    break;
  case CallRefId:
    local_38 = (_Base_ptr)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38,
               (value_type *)(left + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 3));
    uVar3 = left[1].type.id;
    if (uVar3 == right[1].type.id) {
      if (uVar3 != 0) {
        uVar13 = 0;
        do {
          if (left[1].type.id <= uVar13) goto LAB_006a3ad3;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 1) + uVar13 * 8);
          iVar4._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar4._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar13 = uVar13 + 1;
        } while (uVar3 != uVar13);
        uVar3 = right[1].type.id;
        if (uVar3 != 0) {
          uVar13 = 0;
          do {
            if (right[1].type.id <= uVar13) goto LAB_006a3ad3;
            p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 1) + uVar13 * 8);
            iVar4._M_current = *(Expression ***)((long)this + 0x50);
            if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              _M_realloc_insert<wasm::Expression*const&>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                         ((long)this + 0x48),iVar4,(Expression **)&stack0xffffffffffffffb8);
            }
            else {
              *iVar4._M_current = (Expression *)p_Stack_48;
              *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
            }
            uVar13 = uVar13 + 1;
          } while (uVar3 != uVar13);
        }
      }
      if ((char)left[3].type.id == (char)right[3].type.id) {
        return true;
      }
    }
    break;
  case RefTestId:
    if (left[1].type.id != right[1].type.id) {
      return false;
    }
switchD_006a1f00_caseD_12:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 1));
LAB_006a3870:
    pEVar10 = right + 1;
LAB_006a3874:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)pEVar10);
    return true;
  case BrOnId:
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    p_Stack_48 = (_Base_ptr)left[1].type.id;
    child = *(Expression **)(left + 2);
    pEVar10 = *(Expression **)(right + 2);
    iVar6 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
            ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)this,(key_type *)&stack0xffffffffffffffb8);
    if (iVar6._M_node != (_Base_ptr)((long)this + 8)) {
      p_Stack_48 = iVar6._M_node[1]._M_left;
      child = (Expression *)iVar6._M_node[1]._M_right;
    }
    if (child != pEVar10) {
      return false;
    }
    if (*(long *)(left + 3) != *(long *)(right + 3)) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    pEVar10 = (Expression *)&right[2].type;
    goto LAB_006a3874;
  case StructNewId:
    uVar3 = left[1].type.id;
    if (uVar3 != right[1].type.id) {
      return false;
    }
    if (uVar3 == 0) {
      return true;
    }
    local_38 = (_Base_ptr)((long)this + 0x30);
    uVar13 = 0;
    do {
      if (left[1].type.id <= uVar13) goto LAB_006a3ad3;
      p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 1) + uVar13 * 8);
      iVar4._M_current = *(Expression ***)((long)this + 0x38);
      if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4,
                   (Expression **)&stack0xffffffffffffffb8);
      }
      else {
        *iVar4._M_current = (Expression *)p_Stack_48;
        *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
      }
      uVar13 = uVar13 + 1;
    } while (uVar3 != uVar13);
    uVar3 = right[1].type.id;
    if (uVar3 == 0) {
      return true;
    }
    uVar13 = 0;
    while (uVar13 < right[1].type.id) {
      p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 1) + uVar13 * 8);
      iVar4._M_current = *(Expression ***)((long)this + 0x50);
      if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                   ((long)this + 0x48),iVar4,(Expression **)&stack0xffffffffffffffb8);
      }
      else {
        *iVar4._M_current = (Expression *)p_Stack_48;
        *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
      }
      uVar13 = uVar13 + 1;
      if (uVar3 == uVar13) {
        return true;
      }
    }
    goto LAB_006a3ad3;
  case StructGetId:
    if (*(int *)(left + 1) == *(int *)(right + 1)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&left[1].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&right[1].type);
      if ((left[2]._id == right[2]._id) &&
         (*(int *)&left[2].field_0x4 == *(int *)&right[2].field_0x4)) {
        return true;
      }
    }
    break;
  case StructSetId:
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    goto LAB_006a38a0;
  case StructRMWId:
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    if (*(int *)&left[1].field_0x4 != *(int *)&right[1].field_0x4) {
      return false;
    }
LAB_006a38a0:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[1].type);
    if ((int)left[2].type.id != (int)right[2].type.id) {
      return false;
    }
    return true;
  case StructCmpxchgId:
    if (*(int *)(left + 1) == *(int *)(right + 1)) {
      pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,(value_type *)&left[2].type);
      pvVar14 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                ((long)this + 0x48);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar14,(value_type *)&right[2].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,(value_type *)(left + 2));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar14,(value_type *)(right + 2));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,(value_type *)&left[1].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar14,(value_type *)&right[1].type);
      if (*(int *)(left + 3) == *(int *)(right + 3)) {
        return true;
      }
    }
    break;
  case ArrayNewDataId:
  case ArrayNewElemId:
    if (left[1].type.id != right[1].type.id) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    goto LAB_006a20d5;
  case ArrayNewFixedId:
    uVar3 = left[1].type.id;
    if (uVar3 != right[1].type.id) {
      return false;
    }
    if (uVar3 == 0) {
      return true;
    }
    local_38 = (_Base_ptr)((long)this + 0x30);
    uVar13 = 0;
    do {
      if (left[1].type.id <= uVar13) goto LAB_006a3ad3;
      p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 1) + uVar13 * 8);
      iVar4._M_current = *(Expression ***)((long)this + 0x38);
      if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4,
                   (Expression **)&stack0xffffffffffffffb8);
      }
      else {
        *iVar4._M_current = (Expression *)p_Stack_48;
        *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
      }
      uVar13 = uVar13 + 1;
    } while (uVar3 != uVar13);
    uVar3 = right[1].type.id;
    if (uVar3 == 0) {
      return true;
    }
    uVar13 = 0;
    while (uVar13 < right[1].type.id) {
      p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 1) + uVar13 * 8);
      iVar4._M_current = *(Expression ***)((long)this + 0x50);
      if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                   ((long)this + 0x48),iVar4,(Expression **)&stack0xffffffffffffffb8);
      }
      else {
        *iVar4._M_current = (Expression *)p_Stack_48;
        *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
      }
      uVar13 = uVar13 + 1;
      if (uVar3 == uVar13) {
        return true;
      }
    }
    goto LAB_006a3ad3;
  case ArrayGetId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 1));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 1));
    goto LAB_006a2e43;
  case ArrayCopyId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    goto LAB_006a3825;
  case ArrayFillId:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
LAB_006a3825:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
LAB_006a383d:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
LAB_006a3855:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 1));
    goto LAB_006a3870;
  case ArrayInitDataId:
  case ArrayInitElemId:
    if (left[1].type.id != right[1].type.id) {
      return false;
    }
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&left[3].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[3].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&left[2].type);
LAB_006a20d5:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
LAB_006a20f0:
    pEVar10 = right + 2;
    goto LAB_006a3874;
  case RefAsId:
  case StringMeasureId:
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    goto LAB_006a2d2c;
  case StringNewId:
  case StringEncodeId:
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    goto LAB_006a2d11;
  case StringEqId:
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
LAB_006a2d11:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
LAB_006a2d2c:
    pEVar10 = (Expression *)&right[1].type;
    goto LAB_006a3874;
  case ContBindId:
    local_38 = (_Base_ptr)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38,
               (value_type *)(left + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 3));
    uVar3 = left[1].type.id;
    if (uVar3 != right[1].type.id) {
      return false;
    }
    if (uVar3 == 0) {
      return true;
    }
    uVar13 = 0;
    do {
      if (left[1].type.id <= uVar13) goto LAB_006a3ad3;
      p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 1) + uVar13 * 8);
      iVar4._M_current = *(Expression ***)((long)this + 0x38);
      if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4,
                   (Expression **)&stack0xffffffffffffffb8);
      }
      else {
        *iVar4._M_current = (Expression *)p_Stack_48;
        *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
      }
      uVar13 = uVar13 + 1;
    } while (uVar3 != uVar13);
    uVar3 = right[1].type.id;
    if (uVar3 == 0) {
      return true;
    }
    uVar13 = 0;
    while (uVar13 < right[1].type.id) {
      p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 1) + uVar13 * 8);
      iVar4._M_current = *(Expression ***)((long)this + 0x50);
      if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                   ((long)this + 0x48),iVar4,(Expression **)&stack0xffffffffffffffb8);
      }
      else {
        *iVar4._M_current = (Expression *)p_Stack_48;
        *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
      }
      uVar13 = uVar13 + 1;
      if (uVar3 == uVar13) {
        return true;
      }
    }
LAB_006a3ad3:
    pcVar9 = 
    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
    ;
LAB_006a3ae8:
    __assert_fail("index < usedElements",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                  ,0xbc,pcVar9);
  case SuspendId:
    uVar3 = left[2].type.id;
    if (uVar3 != right[2].type.id) {
      return false;
    }
    if (uVar3 != 0) {
      local_38 = (_Base_ptr)((long)this + 0x30);
      uVar13 = 0;
      do {
        if (left[2].type.id <= uVar13) goto LAB_006a3ad3;
        p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 2) + uVar13 * 8);
        iVar4._M_current = *(Expression ***)((long)this + 0x38);
        if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4,
                     (Expression **)&stack0xffffffffffffffb8);
        }
        else {
          *iVar4._M_current = (Expression *)p_Stack_48;
          *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
        }
        uVar13 = uVar13 + 1;
      } while (uVar3 != uVar13);
      uVar3 = right[2].type.id;
      if (uVar3 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x48);
        uVar13 = 0;
        do {
          if (right[2].type.id <= uVar13) goto LAB_006a3ad3;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 2) + uVar13 * 8);
          iVar4._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar4._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar13 = uVar13 + 1;
        } while (uVar3 != uVar13);
      }
    }
    goto switchD_006a1f00_caseD_a;
  case ResumeId:
    uVar13 = *(ulong *)(left + 8);
    if (uVar13 == *(ulong *)(right + 8)) {
      if (uVar13 != 0) {
        uVar11 = 1;
        uVar12 = 0;
        do {
          if (*(long *)(left[7].type.id + uVar12 * 8) != *(long *)(right[7].type.id + uVar12 * 8)) {
            return false;
          }
          uVar12 = (ulong)uVar11;
          uVar11 = uVar11 + 1;
        } while (uVar12 < uVar13);
      }
      local_38 = (_Base_ptr)((long)this + 0x30);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38,
                 (value_type *)(left + 7));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 7));
      uVar3 = left[5].type.id;
      if (uVar3 == right[5].type.id) {
        if (uVar3 != 0) {
          uVar13 = 0;
          do {
            if (left[5].type.id <= uVar13) goto LAB_006a3ad3;
            p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 5) + uVar13 * 8);
            iVar4._M_current = *(Expression ***)((long)this + 0x38);
            if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              _M_realloc_insert<wasm::Expression*const&>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,
                         iVar4,(Expression **)&stack0xffffffffffffffb8);
            }
            else {
              *iVar4._M_current = (Expression *)p_Stack_48;
              *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
            }
            uVar13 = uVar13 + 1;
          } while (uVar3 != uVar13);
          uVar3 = right[5].type.id;
          if (uVar3 != 0) {
            uVar13 = 0;
            do {
              if (right[5].type.id <= uVar13) goto LAB_006a3ad3;
              p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 5) + uVar13 * 8);
              iVar4._M_current = *(Expression ***)((long)this + 0x50);
              if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                _M_realloc_insert<wasm::Expression*const&>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                           ((long)this + 0x48),iVar4,(Expression **)&stack0xffffffffffffffb8);
              }
              else {
                *iVar4._M_current = (Expression *)p_Stack_48;
                *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
              }
              uVar13 = uVar13 + 1;
            } while (uVar3 != uVar13);
          }
        }
        uVar3 = left[3].type.id;
        if (uVar3 == right[3].type.id) {
          if (uVar3 != 0) {
            local_38 = (_Base_ptr)((long)this + 8);
            uVar13 = 0;
            uVar12 = 1;
            do {
              if (right[3].type.id <= uVar13) goto LAB_006a3af2;
              puVar2 = (undefined8 *)(*(long *)(left + 3) + uVar13 * 0x10);
              p_Stack_48 = (_Base_ptr)*puVar2;
              child = (Expression *)puVar2[1];
              pEVar10 = *(Expression **)(*(long *)(right + 3) + 8 + uVar13 * 0x10);
              iVar6 = std::
                      _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                      ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                              *)this,(key_type *)&stack0xffffffffffffffb8);
              if (iVar6._M_node != local_38) {
                p_Stack_48 = iVar6._M_node[1]._M_left;
                child = (Expression *)iVar6._M_node[1]._M_right;
              }
              if (child != pEVar10) {
                return false;
              }
              bVar5 = uVar12 < left[3].type.id;
              uVar13 = uVar12;
              uVar12 = (ulong)((int)uVar12 + 1);
            } while (bVar5);
          }
          uVar13 = left[1].type.id;
          if (uVar13 == right[1].type.id) {
            if (uVar13 == 0) {
              return true;
            }
            uVar11 = 1;
            uVar12 = 0;
            do {
              if (*(long *)(*(long *)(left + 1) + 8 + uVar12 * 0x10) !=
                  *(long *)(*(long *)(right + 1) + 8 + uVar12 * 0x10)) {
                return false;
              }
              uVar12 = (ulong)uVar11;
              uVar11 = uVar11 + 1;
            } while (uVar12 < uVar13);
            return true;
          }
        }
      }
    }
    break;
  case ResumeThrowId:
    uVar13 = *(ulong *)(left + 9);
    if (uVar13 != *(ulong *)(right + 9)) {
      return false;
    }
    if (uVar13 != 0) {
      uVar11 = 1;
      uVar12 = 0;
      do {
        if (*(long *)(left[8].type.id + uVar12 * 8) != *(long *)(right[8].type.id + uVar12 * 8)) {
          return false;
        }
        uVar12 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar12 < uVar13);
    }
    local_38 = (_Base_ptr)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38,
               (value_type *)(left + 8));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 8));
    uVar3 = left[6].type.id;
    if (uVar3 != right[6].type.id) {
      return false;
    }
    if (uVar3 != 0) {
      uVar13 = 0;
      do {
        if (left[6].type.id <= uVar13) goto LAB_006a3ad3;
        p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 6) + uVar13 * 8);
        iVar4._M_current = *(Expression ***)((long)this + 0x38);
        if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4,
                     (Expression **)&stack0xffffffffffffffb8);
        }
        else {
          *iVar4._M_current = (Expression *)p_Stack_48;
          *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
        }
        uVar13 = uVar13 + 1;
      } while (uVar3 != uVar13);
      uVar3 = right[6].type.id;
      if (uVar3 != 0) {
        uVar13 = 0;
        do {
          if (right[6].type.id <= uVar13) goto LAB_006a3ad3;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 6) + uVar13 * 8);
          iVar4._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                       ((long)this + 0x48),iVar4,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar4._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar13 = uVar13 + 1;
        } while (uVar3 != uVar13);
      }
    }
    uVar3 = left[4].type.id;
    if (uVar3 != right[4].type.id) {
      return false;
    }
    if (uVar3 != 0) {
      local_38 = (_Base_ptr)((long)this + 8);
      uVar13 = 0;
      uVar12 = 1;
      do {
        if (right[4].type.id <= uVar13) goto LAB_006a3af2;
        puVar2 = (undefined8 *)(*(long *)(left + 4) + uVar13 * 0x10);
        p_Stack_48 = (_Base_ptr)*puVar2;
        child = (Expression *)puVar2[1];
        pEVar10 = *(Expression **)(*(long *)(right + 4) + 8 + uVar13 * 0x10);
        iVar6 = std::
                _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                        *)this,(key_type *)&stack0xffffffffffffffb8);
        if (iVar6._M_node != local_38) {
          p_Stack_48 = iVar6._M_node[1]._M_left;
          child = (Expression *)iVar6._M_node[1]._M_right;
        }
        if (child != pEVar10) {
          return false;
        }
        bVar5 = uVar12 < left[4].type.id;
        uVar13 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar5);
    }
    uVar13 = left[2].type.id;
    if (uVar13 != right[2].type.id) {
      return false;
    }
    if (uVar13 != 0) {
      uVar11 = 1;
      uVar12 = 0;
      do {
        if (*(long *)(*(long *)(left + 2) + 8 + uVar12 * 0x10) !=
            *(long *)(*(long *)(right + 2) + 8 + uVar12 * 0x10)) {
          return false;
        }
        uVar12 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar12 < uVar13);
    }
    goto switchD_006a1f00_caseD_a;
  case StackSwitchId:
    local_38 = (_Base_ptr)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38,
               (value_type *)(left + 4));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 4));
    uVar3 = left[2].type.id;
    if (uVar3 != right[2].type.id) {
      return false;
    }
    if (uVar3 != 0) {
      uVar13 = 0;
      do {
        if (left[2].type.id <= uVar13) goto LAB_006a3ad3;
        p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 2) + uVar13 * 8);
        iVar4._M_current = *(Expression ***)((long)this + 0x38);
        if (iVar4._M_current == *(Expression ***)((long)this + 0x40)) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar4,
                     (Expression **)&stack0xffffffffffffffb8);
        }
        else {
          *iVar4._M_current = (Expression *)p_Stack_48;
          *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
        }
        uVar13 = uVar13 + 1;
      } while (uVar3 != uVar13);
      uVar3 = right[2].type.id;
      if (uVar3 != 0) {
        uVar13 = 0;
        do {
          if (right[2].type.id <= uVar13) goto LAB_006a3ad3;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 2) + uVar13 * 8);
          iVar4._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar4._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                       ((long)this + 0x48),iVar4,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar4._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar13 = uVar13 + 1;
        } while (uVar3 != uVar13);
      }
    }
switchD_006a1f00_caseD_a:
    if (left[1].type.id == right[1].type.id) {
LAB_006a3ac4:
      return true;
    }
  }
  return false;
}

Assistant:

bool compareNodes(Expression* left, Expression* right) {
      if (left->_id != right->_id) {
        return false;
      }

#define DELEGATE_ID left->_id

// Create cast versions of it for later operations.
#define DELEGATE_START(id)                                                     \
  [[maybe_unused]] auto* castLeft = left->cast<id>();                          \
  [[maybe_unused]] auto* castRight = right->cast<id>();

// Handle each type of field, comparing it appropriately.
#define DELEGATE_FIELD_CHILD(id, field)                                        \
  leftStack.push_back(castLeft->field);                                        \
  rightStack.push_back(castRight->field);

#define DELEGATE_FIELD_CHILD_VECTOR(id, field)                                 \
  if (castLeft->field.size() != castRight->field.size()) {                     \
    return false;                                                              \
  }                                                                            \
  for (auto* child : castLeft->field) {                                        \
    leftStack.push_back(child);                                                \
  }                                                                            \
  for (auto* child : castRight->field) {                                       \
    rightStack.push_back(child);                                               \
  }

#define COMPARE_FIELD(field)                                                   \
  if (castLeft->field != castRight->field) {                                   \
    return false;                                                              \
  }

#define DELEGATE_FIELD_INT(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_LITERAL(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_NAME(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_TYPE(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_HEAPTYPE(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_ADDRESS(id, field) COMPARE_FIELD(field)

#define COMPARE_LIST(field)                                                    \
  if (castLeft->field.size() != castRight->field.size()) {                     \
    return false;                                                              \
  }                                                                            \
  for (Index i = 0; i < castLeft->field.size(); i++) {                         \
    if (castLeft->field[i] != castRight->field[i]) {                           \
      return false;                                                            \
    }                                                                          \
  }

#define DELEGATE_FIELD_INT_ARRAY(id, field) COMPARE_LIST(field)
#define DELEGATE_FIELD_INT_VECTOR(id, field) COMPARE_LIST(field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field) COMPARE_LIST(field)
#define DELEGATE_FIELD_TYPE_VECTOR(id, field) COMPARE_LIST(field)

#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)                               \
  if (castLeft->field.is() != castRight->field.is()) {                         \
    return false;                                                              \
  }                                                                            \
  rightNames[castLeft->field] = castRight->field;

#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)                               \
  if (!compareNames(castLeft->field, castRight->field)) {                      \
    return false;                                                              \
  }

#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)                        \
  if (castLeft->field.size() != castRight->field.size()) {                     \
    return false;                                                              \
  }                                                                            \
  for (Index i = 0; i < castLeft->field.size(); i++) {                         \
    if (!compareNames(castLeft->field[i], castRight->field[i])) {              \
      return false;                                                            \
    }                                                                          \
  }

#include "wasm-delegations-fields.def"

      return true;
    }